

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O3

void Aig_ManCounterExampleValueTest(Aig_Man_t *pAig,Abc_Cex_t *pCex)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  
  uVar1 = pAig->vObjs->nSize;
  if (0 < (int)uVar1) {
    pvVar2 = pAig->vObjs->pArray[uVar1 >> 1];
    iVar4 = 1;
    if (1 < pCex->iFrame) {
      iVar4 = pCex->iFrame;
    }
    printf("\nUsing counter-example, which asserts output %d in frame %d.\n",(ulong)(uint)pCex->iPo)
    ;
    Aig_ManCounterExampleValueStart(pAig,pCex);
    uVar1 = *(uint *)((long)pvVar2 + 0x24);
    uVar3 = Aig_ManCounterExampleValueLookup(pAig,uVar1,iVar4 - 1U);
    printf("Value of object %d in frame %d is %d.\n",(ulong)uVar1,(ulong)(iVar4 - 1U),(ulong)uVar3);
    Aig_ManCounterExampleValueStop(pAig);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Aig_ManCounterExampleValueTest( Aig_Man_t * pAig, Abc_Cex_t * pCex )
{
    Aig_Obj_t * pObj = Aig_ManObj( pAig, Aig_ManObjNumMax(pAig)/2 );
    int iFrame = Abc_MaxInt( 0, pCex->iFrame - 1 );
    printf( "\nUsing counter-example, which asserts output %d in frame %d.\n", pCex->iPo, pCex->iFrame );
    Aig_ManCounterExampleValueStart( pAig, pCex );
    printf( "Value of object %d in frame %d is %d.\n", Aig_ObjId(pObj), iFrame,
        Aig_ManCounterExampleValueLookup(pAig, Aig_ObjId(pObj), iFrame) );
    Aig_ManCounterExampleValueStop( pAig );
}